

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

int __thiscall QComboBoxPrivateContainer::spacing(QComboBoxPrivateContainer *this)

{
  bool bVar1;
  int iVar2;
  QListView *pQVar3;
  QTableView *this_00;
  QTableView *tview;
  QListView *lview;
  QListView *in_stack_ffffffffffffffe0;
  uint local_4;
  
  pQVar3 = qobject_cast<QListView*>((QObject *)0x53443f);
  if (pQVar3 == (QListView *)0x0) {
    this_00 = qobject_cast<QTableView*>((QObject *)0x53446b);
    if (this_00 == (QTableView *)0x0) {
      local_4 = 0;
    }
    else {
      bVar1 = QTableView::showGrid(this_00);
      local_4 = (uint)bVar1;
    }
  }
  else {
    iVar2 = QListView::spacing(in_stack_ffffffffffffffe0);
    local_4 = iVar2 << 1;
  }
  return local_4;
}

Assistant:

int QComboBoxPrivateContainer::spacing() const
{
    QListView *lview = qobject_cast<QListView*>(view);
    if (lview)
        return 2 * lview->spacing(); // QListView::spacing is the padding around the item.
#if QT_CONFIG(tableview)
    QTableView *tview = qobject_cast<QTableView*>(view);
    if (tview)
        return tview->showGrid() ? 1 : 0;
#endif
    return 0;
}